

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

BOOL ReadProcessMemory(HANDLE hProcess,LPCVOID lpBaseAddress,LPVOID lpBuffer,SIZE_T nSize,
                      SIZE_T *lpNumberOfBytesRead)

{
  uint uVar1;
  FILE *__stream;
  DWORD DVar2;
  BOOL BVar3;
  int iVar4;
  ulong uVar5;
  int *pvMem;
  int *piVar6;
  long lVar7;
  uint *puVar8;
  char *pcVar9;
  unsigned_long uVar10;
  ulong local_b0;
  SIZE_T i;
  Param param;
  SIZE_T offset;
  int *lpBaseAddressAligned;
  int *lpTmpBuffer;
  int *ptrInt;
  SIZE_T nbInts;
  Volatile<unsigned_long> local_50;
  Volatile<unsigned_long> numberOfBytesRead;
  Volatile<int> local_40;
  DWORD local_3c;
  Volatile<int> ret;
  DWORD processId;
  CPalThread *pThread;
  SIZE_T *lpNumberOfBytesRead_local;
  SIZE_T nSize_local;
  LPVOID lpBuffer_local;
  LPCVOID lpBaseAddress_local;
  HANDLE hProcess_local;
  
  numberOfBytesRead.m_val._4_4_ = 0;
  Volatile<int>::Volatile(&local_40,(int *)((long)&numberOfBytesRead.m_val + 4));
  nbInts = 0;
  Volatile<unsigned_long>::Volatile(&local_50,&nbInts);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  _ret = CorUnix::InternalGetCurrentThread();
  local_3c = PROCGetProcessIDFromHandle(hProcess);
  if (local_3c == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    SetLastError(6);
  }
  else {
    DVar2 = GetCurrentProcessId();
    if (DVar2 == local_3c) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      Volatile::operator_cast_to_unsigned_long((Volatile *)&local_50);
      Volatile::operator_cast_to_int((Volatile *)&local_40);
      for (local_b0 = 0; local_b0 < nSize; local_b0 = local_b0 + 1) {
        *(undefined1 *)((long)lpBuffer + local_b0) = *(undefined1 *)((long)lpBaseAddress + local_b0)
        ;
      }
      Volatile<unsigned_long>::operator=(&local_50,nSize);
      Volatile<int>::operator=(&local_40,1);
    }
    else {
      BVar3 = DBGAttachProcess(_ret,hProcess,local_3c);
      if (BVar3 != 0) {
        uVar5 = (ulong)lpBaseAddress & 3;
        offset = (long)lpBaseAddress - uVar5;
        ptrInt = (int *)((nSize + uVar5 >> 2) + (long)(int)(uint)((nSize + uVar5 & 3) != 0));
        pvMem = (int *)CorUnix::InternalMalloc((long)ptrInt * 4);
        lpTmpBuffer = pvMem;
        if (pvMem == (int *)0x0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          SetLastError(8);
        }
        else {
          for (; ptrInt != (int *)0x0; ptrInt = (int *)((long)ptrInt + -1)) {
            piVar6 = __errno_location();
            *piVar6 = 0;
            lVar7 = ptrace(PTRACE_PEEKDATA,(ulong)local_3c,offset,0);
            *lpTmpBuffer = (int)lVar7;
            if ((*lpTmpBuffer == -1) && (piVar6 = __errno_location(), *piVar6 != 0)) {
              piVar6 = __errno_location();
              if (*piVar6 == 0xe) {
                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                  abort();
                }
                piVar6 = __errno_location();
                strerror(*piVar6);
                DVar2 = 299;
                if (lpTmpBuffer == pvMem) {
                  DVar2 = 5;
                }
                SetLastError(DVar2);
              }
              else {
                fprintf(_stderr,"] %s %s:%d","ReadProcessMemory",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/debug/debug.cpp"
                        ,0x317);
                DVar2 = local_3c;
                __stream = _stderr;
                puVar8 = (uint *)__errno_location();
                uVar1 = *puVar8;
                piVar6 = __errno_location();
                pcVar9 = strerror(*piVar6);
                fprintf(__stream,"ptrace(PT_READ_D, pid:%d, addr:%p, data:0) failed errno=%d (%s)\n"
                        ,(ulong)DVar2,offset,(ulong)uVar1,pcVar9);
                SetLastError(0x54f);
              }
              goto LAB_00390738;
            }
            offset = offset + 4;
            lpTmpBuffer = lpTmpBuffer + 1;
          }
          memcpy(lpBuffer,(void *)((long)pvMem + uVar5),nSize);
          Volatile<unsigned_long>::operator=(&local_50,nSize);
          Volatile<int>::operator=(&local_40,1);
LAB_00390738:
          if (pvMem != (int *)0x0) {
            CorUnix::InternalFree(pvMem);
          }
        }
        BVar3 = DBGDetachProcess(_ret,hProcess,local_3c);
        if (BVar3 == 0) {
          Volatile<int>::operator=(&local_40,0);
        }
      }
    }
  }
  if (lpNumberOfBytesRead != (SIZE_T *)0x0) {
    uVar10 = Volatile::operator_cast_to_unsigned_long((Volatile *)&local_50);
    *lpNumberOfBytesRead = uVar10;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  Volatile<int>::Load(&local_40);
  iVar4 = Volatile::operator_cast_to_int((Volatile *)&local_40);
  return iVar4;
}

Assistant:

BOOL
PALAPI
ReadProcessMemory(
           IN HANDLE hProcess,
           IN LPCVOID lpBaseAddress,
           IN LPVOID lpBuffer,
           IN SIZE_T nSize,
           OUT SIZE_T * lpNumberOfBytesRead
           )
{
    CPalThread *pThread;
    DWORD processId;
    Volatile<BOOL> ret = FALSE;
    Volatile<SIZE_T> numberOfBytesRead = 0;
#if HAVE_VM_READ
    kern_return_t result;
    vm_map_t task;
    LONG_PTR bytesToRead;
#elif HAVE_PROCFS_CTL
    int fd;
    char memPath[64];
    off_t offset;
#elif !HAVE_TTRACE
    SIZE_T nbInts;
    int* ptrInt;
    int* lpTmpBuffer;
#endif
#if !HAVE_PROCFS_CTL && !HAVE_TTRACE
    int* lpBaseAddressAligned;
    SIZE_T offset;
#endif  // !HAVE_PROCFS_CTL && !HAVE_TTRACE

    PERF_ENTRY(ReadProcessMemory);
    ENTRY("ReadProcessMemory (hProcess=%p,lpBaseAddress=%p, lpBuffer=%p, "
          "nSize=%u, lpNumberOfBytesRead=%p)\n",hProcess,lpBaseAddress,
          lpBuffer, (unsigned int)nSize, lpNumberOfBytesRead);

    pThread = InternalGetCurrentThread();

    if (!(processId = PROCGetProcessIDFromHandle(hProcess)))
    {
        ERROR("Invalid process handler hProcess:%p.",hProcess);
        SetLastError(ERROR_INVALID_HANDLE);
        goto EXIT;
    }

    // Check if the read request is for the current process.
    // We don't need ptrace in that case.
    if (GetCurrentProcessId() == processId)
    {
        TRACE("We are in the same process, so ptrace is not needed\n");

        struct Param
        {
            LPCVOID lpBaseAddress;
            LPVOID lpBuffer;
            SIZE_T nSize;
            SIZE_T numberOfBytesRead;
            BOOL ret;
        } param;
        param.lpBaseAddress = lpBaseAddress;
        param.lpBuffer = lpBuffer;
        param.nSize = nSize;
        param.numberOfBytesRead = numberOfBytesRead;
        param.ret = ret;

        {
            SIZE_T i;

            // Seg fault in memcpy can't be caught
            // so we simulate the memcpy here

            for (i = 0; i<param.nSize; i++)
            {
                *((char*)(param.lpBuffer)+i) = *((char*)(param.lpBaseAddress)+i);
            }

            param.numberOfBytesRead = param.nSize;
            param.ret = TRUE;
        }

        numberOfBytesRead = param.numberOfBytesRead;
        ret = param.ret;
        goto EXIT;
    }

#if HAVE_VM_READ
    result = task_for_pid(mach_task_self(), processId, &task);
    if (result != KERN_SUCCESS)
    {
        ERROR("No Mach task for pid %d: %d\n", processId, ret.Load());
        SetLastError(ERROR_INVALID_HANDLE);
        goto EXIT;
    }
    // vm_read_overwrite usually requires that the address be page-aligned
    // and the size be a multiple of the page size.  We can't differentiate
    // between the cases in which that's required and those in which it
    // isn't, so we do it all the time.
    lpBaseAddressAligned = (int*)((SIZE_T) lpBaseAddress & ~VIRTUAL_PAGE_MASK);
    offset = ((SIZE_T) lpBaseAddress & VIRTUAL_PAGE_MASK);
    char *data;
    data = (char*)alloca(VIRTUAL_PAGE_SIZE);
    while (nSize > 0)
    {
        vm_size_t bytesRead;

        bytesToRead = VIRTUAL_PAGE_SIZE - offset;
        if (bytesToRead > (LONG_PTR)nSize)
        {
            bytesToRead = nSize;
        }
        bytesRead = VIRTUAL_PAGE_SIZE;
        result = vm_read_overwrite(task, (vm_address_t) lpBaseAddressAligned,
                                   VIRTUAL_PAGE_SIZE, (vm_address_t) data, &bytesRead);
        if (result != KERN_SUCCESS || bytesRead != VIRTUAL_PAGE_SIZE)
        {
            ERROR("vm_read_overwrite failed for %d bytes from %p in %d: %d\n",
                  VIRTUAL_PAGE_SIZE, (char *) lpBaseAddressAligned, task, result);
            if (result <= KERN_RETURN_MAX)
            {
                SetLastError(ERROR_INVALID_ACCESS);
            }
            else
            {
                SetLastError(ERROR_INTERNAL_ERROR);
            }
            goto EXIT;
        }
        memcpy((LPSTR)lpBuffer + numberOfBytesRead, data + offset, bytesToRead);
        numberOfBytesRead.Store(numberOfBytesRead.Load() + bytesToRead);
        lpBaseAddressAligned = (int*)((char*)lpBaseAddressAligned + VIRTUAL_PAGE_SIZE);
        nSize -= bytesToRead;
        offset = 0;
    }
    ret = TRUE;
#else   // HAVE_VM_READ
#if HAVE_PROCFS_CTL
    snprintf(memPath, sizeof(memPath), "/proc/%u/%s", processId, PROCFS_MEM_NAME);
    fd = InternalOpen(memPath, O_RDONLY);
    if (fd == -1)
    {
        ERROR("Failed to open %s\n", memPath);
        SetLastError(ERROR_INVALID_ACCESS);
        goto PROCFSCLEANUP;
    }

    //
    // off_t may be greater in size than void*, so first cast to
    // an unsigned type to ensure that no sign extension takes place
    //

    offset = (off_t) (UINT_PTR) lpBaseAddress;

    if (lseek(fd, offset, SEEK_SET) == -1)
    {
        ERROR("Failed to seek to base address\n");
        SetLastError(ERROR_INVALID_ACCESS);
        goto PROCFSCLEANUP;
    }

    numberOfBytesRead = read(fd, lpBuffer, nSize);
    ret = TRUE;

#else   // HAVE_PROCFS_CTL
    // Attach the process before calling ttrace/ptrace otherwise it fails.
    if (DBGAttachProcess(pThread, hProcess, processId))
    {
#if HAVE_TTRACE
        if (ttrace(TT_PROC_RDDATA, processId, 0, (__uint64_t)lpBaseAddress, (__uint64_t)nSize, (__uint64_t)lpBuffer) == -1)
        {
            if (errno == EFAULT)
            {
                ERROR("ttrace(TT_PROC_RDDATA, pid:%d, 0, addr:%p, data:%d, addr2:%d) failed"
                      " errno=%d (%s)\n", processId, lpBaseAddress, (int)nSize, lpBuffer,
                      errno, strerror(errno));

                SetLastError(ERROR_ACCESS_DENIED);
            }
            else
            {
                ASSERT("ttrace(TT_PROC_RDDATA, pid:%d, 0, addr:%p, data:%d, addr2:%d) failed"
                      " errno=%d (%s)\n", processId, lpBaseAddress, (int)nSize, lpBuffer,
                      errno, strerror(errno));
                SetLastError(ERROR_INTERNAL_ERROR);
            }

            goto CLEANUP1;
        }

        numberOfBytesRead = nSize;
        ret = TRUE;

#else   // HAVE_TTRACE

        offset = (SIZE_T)lpBaseAddress % sizeof(int);
        lpBaseAddressAligned =  (int*)((char*)lpBaseAddress - offset);
        nbInts = (nSize + offset)/sizeof(int) +
                 ((nSize + offset)%sizeof(int) ? 1:0);

        /* before transferring any data to lpBuffer we should make sure that all
           data is accessible for read. so we need to use a temp buffer for that.*/
        if (!(lpTmpBuffer = (int*)InternalMalloc((nbInts * sizeof(int)))))
        {
            ERROR("Insufficient memory available !\n");
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto CLEANUP1;
        }

        for (ptrInt = lpTmpBuffer; nbInts; ptrInt++,
            lpBaseAddressAligned++, nbInts--)
        {
            errno = 0;
            *ptrInt =
                PAL_PTRACE(PAL_PT_READ_D, processId, lpBaseAddressAligned, 0);
            if (*ptrInt == -1 && errno)
            {
                if (errno == EFAULT)
                {
                    ERROR("ptrace(PT_READ_D, pid:%d, addr:%p, data:0) failed"
                          " errno=%d (%s)\n", processId, lpBaseAddressAligned,
                          errno, strerror(errno));

                    SetLastError(ptrInt == lpTmpBuffer ? ERROR_ACCESS_DENIED :
                                                         ERROR_PARTIAL_COPY);
                }
                else
                {
                    ASSERT("ptrace(PT_READ_D, pid:%d, addr:%p, data:0) failed"
                          " errno=%d (%s)\n", processId, lpBaseAddressAligned,
                          errno, strerror(errno));
                    SetLastError(ERROR_INTERNAL_ERROR);
                }

                goto CLEANUP2;
            }
        }

        /* transfer data from temp buffer to lpBuffer */
        memcpy( (char *)lpBuffer, ((char*)lpTmpBuffer) + offset, nSize);
        numberOfBytesRead = nSize;
        ret = TRUE;
#endif // HAVE_TTRACE
    }
    else
    {
        /* Failed to attach processId */
        goto EXIT;
    }
#endif  // HAVE_PROCFS_CTL

#if HAVE_PROCFS_CTL
PROCFSCLEANUP:
    if (fd != -1)
    {
        close(fd);
    }
#elif !HAVE_TTRACE
CLEANUP2:
    if (lpTmpBuffer)
    {
        InternalFree(lpTmpBuffer);
    }
#endif  // !HAVE_TTRACE

#if !HAVE_PROCFS_CTL
CLEANUP1:
    if (!DBGDetachProcess(pThread, hProcess, processId))
    {
        /* Failed to detach processId */
        ret = FALSE;
    }
#endif  // HAVE_PROCFS_CTL
#endif  // HAVE_VM_READ

EXIT:
    if (lpNumberOfBytesRead)
    {
        *lpNumberOfBytesRead = numberOfBytesRead;
    }
    LOGEXIT("ReadProcessMemory returns BOOL %d\n", ret.Load());
    PERF_EXIT(ReadProcessMemory);
    return ret;
}